

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base642midi.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  size_t in_RCX;
  void *__buf;
  allocator local_18a;
  allocator local_189;
  string filename;
  MidiFile midifile;
  Options opts;
  
  smf::Options::Options(&opts);
  smf::Options::setOptions(&opts,argc,argv);
  std::__cxx11::string::string((string *)&midifile,"o|output=s:test.mid",&local_18a);
  std::__cxx11::string::string((string *)&filename,"Output filename",&local_189);
  smf::Options::define(&opts,(string *)&midifile,&filename);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::~string((string *)&midifile);
  smf::Options::process(&opts,1,0);
  iVar1 = smf::Options::getArgCount(&opts);
  if (iVar1 == 0) {
    std::__cxx11::string::string((string *)&midifile,"output",&local_18a);
    smf::Options::getString(&filename,&opts,(string *)&midifile);
    std::__cxx11::string::~string((string *)&midifile);
    smf::MidiFile::MidiFile(&midifile);
    smf::MidiFile::readBase64(&midifile,(istream *)&std::cin);
    smf::MidiFile::write(&midifile,(int)&filename,__buf,in_RCX);
    smf::MidiFile::~MidiFile(&midifile);
    std::__cxx11::string::~string((string *)&filename);
    smf::Options::~Options(&opts);
    return 0;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: cat base64.txt | ");
  smf::Options::getCommand_abi_cxx11_((string *)&midifile,&opts);
  poVar2 = std::operator<<(poVar2,(string *)&midifile);
  poVar2 = std::operator<<(poVar2," -o output.mid ");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&midifile);
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
	Options opts;
	opts.setOptions(argc, argv);
	opts.define("o|output=s:test.mid", "Output filename");
	opts.process();
	if (opts.getArgCount() != 0) {
		cerr << "Usage: cat base64.txt | " << opts.getCommand() << " -o output.mid " << endl;
		exit(1);
	}

	string filename = opts.getString("output");

	MidiFile midifile;
	midifile.readBase64(cin);
	midifile.write(filename);
	return 0;
}